

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool_t bVar1;
  bfile_t *bfile;
  prf_model_t *model_00;
  FILE *__stream;
  prf_model_t *in_RSI;
  int in_EDI;
  FILE *vrml;
  prf_model_t *model;
  bfile_t *modelfile;
  char *in_stack_00000070;
  int local_4;
  
  if ((in_EDI == 1) || (3 < in_EDI)) {
    fprintf(_stderr,"Usage: %s <flt-file> [<filename.wrl>]\n",in_RSI->header);
    local_4 = -1;
  }
  else {
    prf_init();
    bfile = bf_create_r(in_stack_00000070);
    if (bfile == (bfile_t *)0x0) {
      fprintf(_stderr,"Error: Couldn\'t open file named \"%s\".\n",
              *(undefined8 *)&in_RSI->mempool_id);
      prf_exit();
      local_4 = -1;
    }
    else {
      model_00 = prf_model_create();
      prf_model_poolmem((prf_model_t *)0x104787);
      bVar1 = prf_model_load(in_RSI,bfile);
      if (bVar1 == 0) {
        bf_destroy((bfile_t *)0x1047a5);
        prf_model_destroy(model_00);
        prf_exit();
        fprintf(_stderr,"Error: Couldn\'t load Open Flight file \"%s\".\n",
                *(undefined8 *)&in_RSI->mempool_id);
        local_4 = -1;
      }
      else {
        bf_destroy((bfile_t *)0x1047ec);
        __stream = _stdout;
        if ((in_EDI == 3) &&
           (__stream = fopen((char *)in_RSI->vertex_palette,"w"), __stream == (FILE *)0x0)) {
          perror("fopen()");
          prf_model_destroy(model_00);
          prf_exit();
          local_4 = -1;
        }
        else {
          flt2vrml(model_00,(FILE *)__stream);
          if (in_EDI == 3) {
            fclose(__stream);
          }
          prf_model_destroy(model_00);
          prf_exit();
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv )
{
  bfile_t * modelfile;
  prf_model_t * model;
  FILE * vrml;

  if ( argc == 1 || argc > 3 ) {
    fprintf( stderr, "Usage: %s <flt-file> [<filename.wrl>]\n", argv[0] );
    return -1;
  }

  prf_init();

  modelfile = bf_create_r( argv[1] );
  if ( ! modelfile ) {
    fprintf( stderr, "Error: Couldn't open file named \"%s\".\n", argv[1] );
    prf_exit();
    return -1;
  }

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, modelfile ) ) {
    bf_destroy( modelfile );
    prf_model_destroy( model );
    prf_exit();
    fprintf( stderr, "Error: Couldn't load Open Flight file \"%s\".\n",
      argv[1] );
    return -1;
  }
  bf_destroy( modelfile );

  if ( argc == 3 ) {
    vrml = fopen( argv[2], "w" );
    if ( ! vrml ) {
      perror( "fopen()" );
      prf_model_destroy( model );
      prf_exit();
      return -1;
    }
  } else {
    vrml = stdout;
  }

  flt2vrml( model, vrml );

  if ( argc == 3 ) fclose( vrml );
  prf_model_destroy( model );
  prf_exit();
  return 0;
}